

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

void Fra_ImpAddToSolver(Fra_Man_t *p,Vec_Int_t *vImps,int *pSatVarNums)

{
  int iVar1;
  sat_solver *s;
  Vec_Ptr_t *pVVar2;
  Fra_Par_t *pFVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  int pLits [2];
  uint local_48;
  int local_44;
  long local_40;
  Vec_Int_t *local_38;
  
  s = p->pSat;
  if (0 < vImps->nSize) {
    lVar11 = 0;
    local_38 = vImps;
    do {
      uVar6 = local_38->pArray[lVar11];
      pVVar2 = p->pManAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        uVar8 = uVar6 & 0xffff;
        if (pVVar2->nSize <= (int)uVar8) goto LAB_00694651;
        pvVar10 = pVVar2->pArray[uVar8];
      }
      local_40 = lVar11;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        uVar6 = (int)uVar6 >> 0x10;
        if (((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) {
LAB_00694651:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = pVVar2->pArray[uVar6];
      }
      pFVar3 = p->pPars;
      uVar6 = pFVar3->nFramesK;
      if ((int)uVar6 < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if (((*(byte *)((*(ulong *)((long)*(int *)((long)pvVar10 + 0x24) *
                                      (long)*(int *)(*(long *)((long)pvVar10 + 0x28) + 0x18) * 8 +
                                      *(long *)(*(long *)((long)pvVar10 + 0x28) + 0x20) + uVar9 * 8)
                          & 0xfffffffffffffffe) + 0x18) & 7) == 0) ||
             ((*(byte *)((*(ulong *)((long)*(int *)(*(long *)((long)pvVar7 + 0x28) + 0x18) *
                                     (long)*(int *)((long)pvVar7 + 0x24) * 8 +
                                     *(long *)(*(long *)((long)pvVar7 + 0x28) + 0x20) + uVar9 * 8) &
                         0xfffffffffffffffe) + 0x18) & 7) == 0)) {
            local_38->pArray[lVar11] = 0;
            goto LAB_006944ce;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        uVar9 = (ulong)uVar6;
      }
LAB_006944ce:
      if ((pFVar3->nFramesK <= (int)uVar9) && (0 < p->pPars->nFramesK)) {
        lVar11 = 0;
        do {
          uVar9 = *(ulong *)(*(long *)(*(long *)((long)pvVar10 + 0x28) + 0x20) +
                            ((long)*(int *)((long)pvVar10 + 0x24) *
                             (long)*(int *)(*(long *)((long)pvVar10 + 0x28) + 0x18) + lVar11) * 8);
          iVar5 = pSatVarNums[*(int *)((uVar9 & 0xfffffffffffffffe) + 0x24)];
          if ((iVar5 < 1) || (p->nSatVars <= iVar5)) {
            __assert_fail("Left > 0 && Left < p->nSatVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                          ,0x1cf,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
          }
          uVar4 = *(ulong *)(*(long *)(*(long *)((long)pvVar7 + 0x28) + 0x20) +
                            ((long)*(int *)((long)pvVar7 + 0x24) *
                             (long)*(int *)(*(long *)((long)pvVar7 + 0x28) + 0x18) + lVar11) * 8);
          iVar1 = pSatVarNums[*(int *)((uVar4 & 0xfffffffffffffffe) + 0x24)];
          if ((iVar1 < 1) || (p->nSatVars <= iVar1)) {
            __assert_fail("Right > 0 && Right < p->nSatVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                          ,0x1d0,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
          }
          local_48 = (((uint)uVar9 ^ *(uint *)((long)pvVar10 + 0x18) >> 3) & 1) + iVar5 * 2 ^ 1;
          local_44 = (((uint)uVar4 ^ *(uint *)((long)pvVar7 + 0x18) >> 3) & 1) + iVar1 * 2;
          iVar5 = sat_solver_addclause(s,(lit *)&local_48,(lit *)&local_40);
          if (iVar5 == 0) {
            sat_solver_delete(s);
            p->pSat = (sat_solver *)0x0;
            return;
          }
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 < p->pPars->nFramesK);
      }
      lVar11 = local_40 + 1;
      vImps = local_38;
    } while (lVar11 < local_38->nSize);
  }
  iVar5 = sat_solver_simplify(s);
  if (iVar5 == 0) {
    sat_solver_delete(s);
    p->pSat = (sat_solver *)0x0;
  }
  Fra_ImpCompactArray(vImps);
  return;
}

Assistant:

void Fra_ImpAddToSolver( Fra_Man_t * p, Vec_Int_t * vImps, int * pSatVarNums )
{
    sat_solver * pSat = p->pSat;
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int pLits[2], Imp, Left, Right, i, f, status;
    int fComplL, fComplR;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if all the nodes are present
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            if ( Aig_ObjIsNone(Aig_Regular(pLeftF)) || Aig_ObjIsNone(Aig_Regular(pRightF)) )
            {
                Vec_IntWriteEntry( vImps, i, 0 );
                break;
            }
        } 
        if ( f < p->pPars->nFramesK )
            continue;
        // add constraints in each timeframe
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            // get the corresponding SAT numbers
            Left = pSatVarNums[ Aig_Regular(pLeftF)->Id ];
            Right = pSatVarNums[ Aig_Regular(pRightF)->Id ];
            assert( Left > 0  && Left < p->nSatVars );
            assert( Right > 0 && Right < p->nSatVars );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
            // get the constraint
            // L => R      L' v R     (complement = L & R')
            pLits[0] = 2 * Left  + !fComplL;
            pLits[1] = 2 * Right +  fComplR;
            // add constraint to solver
            if ( !sat_solver_addclause( pSat, pLits, pLits + 2 ) )
            {
                sat_solver_delete( pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        p->pSat = NULL;
    }
//    printf( "Total imps = %d. ", Vec_IntSize(vImps) );
    Fra_ImpCompactArray( vImps );
//    printf( "Valid imps = %d. \n", Vec_IntSize(vImps) );
}